

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrtran.c
# Opt level: O3

void png_do_expand(png_row_infop row_info,png_bytep row,png_const_color_16p trans_color)

{
  png_byte *ppVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  png_uint_16 pVar5;
  png_uint_16 pVar6;
  byte bVar7;
  uint uVar8;
  png_bytep ppVar9;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  png_byte *ppVar14;
  png_uint_16 pVar15;
  byte *pbVar16;
  uint uVar17;
  byte *pbVar18;
  png_byte pVar19;
  uint uVar20;
  bool bVar21;
  
  uVar17 = row_info->width;
  uVar11 = (ulong)uVar17;
  if (row_info->color_type == '\0') {
    if (trans_color == (png_const_color_16p)0x0) {
      pVar15 = 0;
    }
    else {
      pVar15 = trans_color->gray;
    }
    bVar7 = row_info->bit_depth;
    if (bVar7 < 8) {
      uVar13 = uVar11;
      if (bVar7 == 1) {
        uVar8 = 0xff;
        if ((pVar15 & 1) == 0) {
          uVar8 = 0;
        }
        pVar15 = (png_uint_16)uVar8;
        uVar13 = 0;
        if (uVar17 != 0) {
          uVar8 = -uVar17 & 7;
          pbVar18 = row + (uVar17 - 1 >> 3);
          ppVar9 = row + uVar11;
          uVar12 = uVar11;
          do {
            ppVar9 = ppVar9 + -1;
            *ppVar9 = -((*pbVar18 >> (uVar8 & 0x1f) & 1) != 0);
            bVar21 = uVar8 == 7;
            uVar8 = uVar8 + 1;
            if (bVar21) {
              uVar8 = 0;
            }
            pbVar18 = pbVar18 + -(ulong)bVar21;
            uVar20 = (int)uVar12 - 1;
            uVar12 = (ulong)uVar20;
            uVar13 = uVar11;
          } while (uVar20 != 0);
        }
      }
      else if (bVar7 == 2) {
        pVar15 = (pVar15 & 3) * 0x55;
        uVar13 = 0;
        if (uVar17 != 0) {
          uVar8 = ~(uVar17 * 2 + 6) & 6;
          pbVar18 = row + (uVar17 - 1 >> 2);
          ppVar9 = row + uVar11;
          uVar12 = uVar11;
          do {
            ppVar9 = ppVar9 + -1;
            *ppVar9 = (*pbVar18 >> ((byte)uVar8 & 0x1f) & 3) * 'U';
            bVar21 = uVar8 == 6;
            uVar8 = uVar8 + 2;
            if (bVar21) {
              uVar8 = 0;
            }
            pbVar18 = pbVar18 + -(ulong)bVar21;
            uVar20 = (int)uVar12 - 1;
            uVar12 = (ulong)uVar20;
            uVar13 = uVar11;
          } while (uVar20 != 0);
        }
      }
      else if (bVar7 == 4) {
        pVar15 = (pVar15 & 0xf) << 4 | pVar15 & 0xf;
        if (uVar17 == 0) {
          uVar13 = 0;
        }
        else {
          uVar8 = uVar17 * 4 & 4;
          pbVar16 = row + (uVar17 - 1 >> 1);
          pbVar18 = row + uVar11;
          uVar12 = uVar11;
          do {
            pbVar18 = pbVar18 + -1;
            bVar7 = *pbVar16 >> (sbyte)uVar8;
            *pbVar18 = bVar7 << 4 | bVar7 & 0xf;
            pbVar16 = pbVar16 + -(ulong)(uVar8 != 0);
            uVar8 = (uint)(uVar8 == 0) << 2;
            uVar20 = (int)uVar12 - 1;
            uVar12 = (ulong)uVar20;
          } while (uVar20 != 0);
        }
      }
      bVar7 = 8;
      row_info->bit_depth = '\b';
      row_info->pixel_depth = '\b';
      row_info->rowbytes = uVar13;
    }
    if (trans_color == (png_const_color_16p)0x0) {
      return;
    }
    if (bVar7 == 0x10) {
      if (uVar17 != 0) {
        sVar10 = row_info->rowbytes;
        uVar13 = uVar11;
        do {
          if ((row[sVar10 - 2] == (png_byte)(pVar15 >> 8)) && (row[sVar10 - 1] == (png_byte)pVar15))
          {
            pVar19 = '\0';
          }
          else {
            pVar19 = 0xff;
          }
          row[sVar10 * 2 + -1] = pVar19;
          row[sVar10 * 2 + -2] = pVar19;
          row[sVar10 * 2 + -3] = row[sVar10 - 1];
          row[sVar10 * 2 + -4] = row[sVar10 - 2];
          sVar10 = sVar10 - 2;
          uVar17 = (int)uVar13 - 1;
          uVar13 = (ulong)uVar17;
        } while (uVar17 != 0);
      }
    }
    else {
      uVar13 = uVar11;
      if (bVar7 == 8) {
        while (uVar17 != 0) {
          row[uVar13 * 2 + -1] = -(row[uVar13 - 1] != (png_byte)pVar15);
          row[uVar13 * 2 + -2] = row[uVar13 - 1];
          uVar17 = (uint)(uVar13 - 1);
          uVar13 = uVar13 - 1;
        }
      }
    }
    row_info->color_type = '\x04';
    row_info->channels = '\x02';
    bVar7 = row_info->bit_depth * '\x02';
  }
  else {
    if (trans_color == (png_const_color_16p)0x0 || row_info->color_type != '\x02') {
      return;
    }
    if (row_info->bit_depth == '\x10') {
      if (uVar17 != 0) {
        uVar2 = trans_color->red;
        uVar3 = trans_color->green;
        uVar4 = trans_color->blue;
        ppVar9 = row + uVar11 * 8 + -1;
        ppVar14 = row + (row_info->rowbytes - 1);
        uVar13 = uVar11;
        do {
          if ((((uVar2 >> 8 == (ushort)ppVar14[-5]) && (ppVar14[-4] == (png_byte)uVar2)) &&
              (uVar3 >> 8 == (ushort)ppVar14[-3])) &&
             (((ppVar14[-2] == (png_byte)uVar3 && (uVar4 >> 8 == (ushort)ppVar14[-1])) &&
              (*ppVar14 == (png_byte)uVar4)))) {
            pVar19 = '\0';
          }
          else {
            pVar19 = 0xff;
          }
          *ppVar9 = pVar19;
          ppVar9[-1] = pVar19;
          ppVar9[-2] = *ppVar14;
          ppVar9[-3] = ppVar14[-1];
          ppVar9[-4] = ppVar14[-2];
          ppVar9[-5] = ppVar14[-3];
          ppVar9[-6] = ppVar14[-4];
          ppVar1 = ppVar14 + -5;
          ppVar14 = ppVar14 + -6;
          ppVar9[-7] = *ppVar1;
          ppVar9 = ppVar9 + -8;
          uVar17 = (int)uVar13 - 1;
          uVar13 = (ulong)uVar17;
        } while (uVar17 != 0);
      }
    }
    else if ((row_info->bit_depth == '\b') && (uVar17 != 0)) {
      ppVar9 = row + uVar11 * 4 + -1;
      ppVar14 = row + (row_info->rowbytes - 1);
      pVar15 = trans_color->blue;
      pVar5 = trans_color->red;
      pVar6 = trans_color->green;
      uVar13 = uVar11;
      do {
        if (((ppVar14[-2] == (png_byte)pVar5) && (ppVar14[-1] == (png_byte)pVar6)) &&
           (*ppVar14 == (png_byte)pVar15)) {
          pVar19 = '\0';
        }
        else {
          pVar19 = 0xff;
        }
        *ppVar9 = pVar19;
        ppVar9[-1] = *ppVar14;
        ppVar9[-2] = ppVar14[-1];
        ppVar1 = ppVar14 + -2;
        ppVar14 = ppVar14 + -3;
        ppVar9[-3] = *ppVar1;
        ppVar9 = ppVar9 + -4;
        uVar17 = (int)uVar13 - 1;
        uVar13 = (ulong)uVar17;
      } while (uVar17 != 0);
    }
    row_info->color_type = '\x06';
    row_info->channels = '\x04';
    bVar7 = row_info->bit_depth << 2;
  }
  row_info->pixel_depth = bVar7;
  if (bVar7 < 8) {
    uVar11 = bVar7 * uVar11 + 7 >> 3;
  }
  else {
    uVar11 = (bVar7 >> 3) * uVar11;
  }
  row_info->rowbytes = uVar11;
  return;
}

Assistant:

static void
png_do_expand(png_row_infop row_info, png_bytep row,
    png_const_color_16p trans_color)
{
   int shift, value;
   png_bytep sp, dp;
   png_uint_32 i;
   png_uint_32 row_width=row_info->width;

   png_debug(1, "in png_do_expand");

   if (row_info->color_type == PNG_COLOR_TYPE_GRAY)
   {
      unsigned int gray = trans_color != NULL ? trans_color->gray : 0;

      if (row_info->bit_depth < 8)
      {
         switch (row_info->bit_depth)
         {
            case 1:
            {
               gray = (gray & 0x01) * 0xff;
               sp = row + (size_t)((row_width - 1) >> 3);
               dp = row + (size_t)row_width - 1;
               shift = 7 - (int)((row_width + 7) & 0x07);
               for (i = 0; i < row_width; i++)
               {
                  if ((*sp >> shift) & 0x01)
                     *dp = 0xff;

                  else
                     *dp = 0;

                  if (shift == 7)
                  {
                     shift = 0;
                     sp--;
                  }

                  else
                     shift++;

                  dp--;
               }
               break;
            }

            case 2:
            {
               gray = (gray & 0x03) * 0x55;
               sp = row + (size_t)((row_width - 1) >> 2);
               dp = row + (size_t)row_width - 1;
               shift = (int)((3 - ((row_width + 3) & 0x03)) << 1);
               for (i = 0; i < row_width; i++)
               {
                  value = (*sp >> shift) & 0x03;
                  *dp = (png_byte)(value | (value << 2) | (value << 4) |
                     (value << 6));
                  if (shift == 6)
                  {
                     shift = 0;
                     sp--;
                  }

                  else
                     shift += 2;

                  dp--;
               }
               break;
            }

            case 4:
            {
               gray = (gray & 0x0f) * 0x11;
               sp = row + (size_t)((row_width - 1) >> 1);
               dp = row + (size_t)row_width - 1;
               shift = (int)((1 - ((row_width + 1) & 0x01)) << 2);
               for (i = 0; i < row_width; i++)
               {
                  value = (*sp >> shift) & 0x0f;
                  *dp = (png_byte)(value | (value << 4));
                  if (shift == 4)
                  {
                     shift = 0;
                     sp--;
                  }

                  else
                     shift = 4;

                  dp--;
               }
               break;
            }

            default:
               break;
         }

         row_info->bit_depth = 8;
         row_info->pixel_depth = 8;
         row_info->rowbytes = row_width;
      }

      if (trans_color != NULL)
      {
         if (row_info->bit_depth == 8)
         {
            gray = gray & 0xff;
            sp = row + (size_t)row_width - 1;
            dp = row + ((size_t)row_width << 1) - 1;

            for (i = 0; i < row_width; i++)
            {
               if ((*sp & 0xffU) == gray)
                  *dp-- = 0;

               else
                  *dp-- = 0xff;

               *dp-- = *sp--;
            }
         }

         else if (row_info->bit_depth == 16)
         {
            unsigned int gray_high = (gray >> 8) & 0xff;
            unsigned int gray_low = gray & 0xff;
            sp = row + row_info->rowbytes - 1;
            dp = row + (row_info->rowbytes << 1) - 1;
            for (i = 0; i < row_width; i++)
            {
               if ((*(sp - 1) & 0xffU) == gray_high &&
                   (*(sp) & 0xffU) == gray_low)
               {
                  *dp-- = 0;
                  *dp-- = 0;
               }

               else
               {
                  *dp-- = 0xff;
                  *dp-- = 0xff;
               }

               *dp-- = *sp--;
               *dp-- = *sp--;
            }
         }

         row_info->color_type = PNG_COLOR_TYPE_GRAY_ALPHA;
         row_info->channels = 2;
         row_info->pixel_depth = (png_byte)(row_info->bit_depth << 1);
         row_info->rowbytes = PNG_ROWBYTES(row_info->pixel_depth,
             row_width);
      }
   }
   else if (row_info->color_type == PNG_COLOR_TYPE_RGB &&
       trans_color != NULL)
   {
      if (row_info->bit_depth == 8)
      {
         png_byte red = (png_byte)(trans_color->red & 0xff);
         png_byte green = (png_byte)(trans_color->green & 0xff);
         png_byte blue = (png_byte)(trans_color->blue & 0xff);
         sp = row + (size_t)row_info->rowbytes - 1;
         dp = row + ((size_t)row_width << 2) - 1;
         for (i = 0; i < row_width; i++)
         {
            if (*(sp - 2) == red && *(sp - 1) == green && *(sp) == blue)
               *dp-- = 0;

            else
               *dp-- = 0xff;

            *dp-- = *sp--;
            *dp-- = *sp--;
            *dp-- = *sp--;
         }
      }
      else if (row_info->bit_depth == 16)
      {
         png_byte red_high = (png_byte)((trans_color->red >> 8) & 0xff);
         png_byte green_high = (png_byte)((trans_color->green >> 8) & 0xff);
         png_byte blue_high = (png_byte)((trans_color->blue >> 8) & 0xff);
         png_byte red_low = (png_byte)(trans_color->red & 0xff);
         png_byte green_low = (png_byte)(trans_color->green & 0xff);
         png_byte blue_low = (png_byte)(trans_color->blue & 0xff);
         sp = row + row_info->rowbytes - 1;
         dp = row + ((size_t)row_width << 3) - 1;
         for (i = 0; i < row_width; i++)
         {
            if (*(sp - 5) == red_high &&
                *(sp - 4) == red_low &&
                *(sp - 3) == green_high &&
                *(sp - 2) == green_low &&
                *(sp - 1) == blue_high &&
                *(sp    ) == blue_low)
            {
               *dp-- = 0;
               *dp-- = 0;
            }

            else
            {
               *dp-- = 0xff;
               *dp-- = 0xff;
            }

            *dp-- = *sp--;
            *dp-- = *sp--;
            *dp-- = *sp--;
            *dp-- = *sp--;
            *dp-- = *sp--;
            *dp-- = *sp--;
         }
      }
      row_info->color_type = PNG_COLOR_TYPE_RGB_ALPHA;
      row_info->channels = 4;
      row_info->pixel_depth = (png_byte)(row_info->bit_depth << 2);
      row_info->rowbytes = PNG_ROWBYTES(row_info->pixel_depth, row_width);
   }
}